

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.c
# Opt level: O0

void av1_copy_and_extend_frame(YV12_BUFFER_CONFIG *src,YV12_BUFFER_CONFIG *dst)

{
  uint h;
  uint uVar1;
  int extend_bottom;
  int iVar2;
  int extend_top;
  int iVar3;
  undefined4 uVar4;
  long lVar5;
  long in_RSI;
  int *in_RDI;
  uint8_t *src_v_buffer;
  int chroma_step;
  int er_uv;
  int eb_uv;
  int el_uv;
  int et_uv;
  int uv_height_subsampling;
  int uv_width_subsampling;
  int eb_y;
  int er_y;
  int el_y;
  int et_y;
  int in_stack_ffffffffffffff94;
  undefined8 in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa8;
  int src_pitch;
  long lVar6;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar7;
  int extend_right;
  
  extend_right = *(int *)(in_RSI + 0x80);
  if ((int)(*in_RDI + 0x3fU & 0xffffffc0) < *in_RDI + *(int *)(in_RSI + 0x80)) {
    h = *in_RDI + *(int *)(in_RSI + 0x80);
  }
  else {
    h = *in_RDI + 0x3fU & 0xffffffc0;
  }
  if ((int)(in_RDI[2] + 0x3fU & 0xffffffc0) < in_RDI[2] + *(int *)(in_RSI + 0x80)) {
    uVar1 = in_RDI[2] + *(int *)(in_RSI + 0x80);
  }
  else {
    uVar1 = in_RDI[2] + 0x3fU & 0xffffffc0;
  }
  extend_bottom = uVar1 - in_RDI[6];
  iVar7 = in_RDI[0x25];
  iVar2 = *(int *)(in_RSI + 0x80) >> ((byte)iVar7 & 0x1f);
  extend_top = extend_right >> ((byte)in_RDI[0x24] & 0x1f);
  iVar3 = extend_bottom >> ((byte)iVar7 & 0x1f);
  src_pitch = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  if ((in_RDI[0x30] & 8U) == 0) {
    copy_and_extend_plane
              ((uint8_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),src_pitch,
               (uint8_t *)CONCAT44(h,uVar1),(int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
               (int)in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,extend_top,iVar7,
               extend_bottom,extend_right,(int)in_RSI);
    iVar2 = (int)in_RSI;
    if ((char)in_RDI[0x2a] == '\0') {
      uVar4 = 2;
      if (*(long *)(in_RDI + 0xe) != 0) {
        uVar4 = 1;
      }
      if (*(long *)(in_RDI + 0xe) == 0) {
        lVar5 = *(long *)(in_RDI + 0xc) + 1;
      }
      else {
        lVar5 = *(long *)(in_RDI + 0xe);
      }
      iVar3 = (int)((ulong)lVar5 >> 0x20);
      lVar6 = lVar5;
      copy_and_extend_plane
                ((uint8_t *)CONCAT44(uVar4,in_stack_ffffffffffffffb0),iVar3,
                 (uint8_t *)CONCAT44(h,uVar1),iVar3,(int)lVar5,in_stack_ffffffffffffff94,extend_top,
                 iVar7,extend_bottom,extend_right,iVar2);
      copy_and_extend_plane
                ((uint8_t *)CONCAT44(uVar4,in_stack_ffffffffffffffb0),(int)((ulong)lVar6 >> 0x20),
                 (uint8_t *)CONCAT44(h,uVar1),(int)((ulong)lVar5 >> 0x20),(int)lVar5,
                 in_stack_ffffffffffffff94,extend_top,iVar7,extend_bottom,extend_right,iVar2);
    }
  }
  else {
    highbd_copy_and_extend_plane
              ((uint8_t *)CONCAT44(iVar2,extend_top),iVar3,
               (uint8_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),src_pitch,
               (int)in_stack_ffffffffffffffa8,h,extend_bottom,extend_right,(int)in_RSI,(int)in_RDI);
    iVar7 = (int)in_RSI;
    if ((char)in_RDI[0x2a] == '\0') {
      highbd_copy_and_extend_plane
                ((uint8_t *)CONCAT44(iVar2,extend_top),iVar3,
                 (uint8_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),(int)in_stack_ffffffffffffffa8,h,
                 extend_bottom,extend_right,iVar7,(int)in_RDI);
      highbd_copy_and_extend_plane
                ((uint8_t *)CONCAT44(iVar2,extend_top),iVar3,
                 (uint8_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),(int)in_stack_ffffffffffffffa8,h,
                 extend_bottom,extend_right,iVar7,(int)in_RDI);
    }
  }
  return;
}

Assistant:

void av1_copy_and_extend_frame(const YV12_BUFFER_CONFIG *src,
                               YV12_BUFFER_CONFIG *dst) {
  // Extend src frame in buffer
  const int et_y = dst->border;
  const int el_y = dst->border;
  const int er_y =
      AOMMAX(src->y_width + dst->border, ALIGN_POWER_OF_TWO(src->y_width, 6)) -
      src->y_crop_width;
  const int eb_y = AOMMAX(src->y_height + dst->border,
                          ALIGN_POWER_OF_TWO(src->y_height, 6)) -
                   src->y_crop_height;
  const int uv_width_subsampling = src->subsampling_x;
  const int uv_height_subsampling = src->subsampling_y;
  const int et_uv = et_y >> uv_height_subsampling;
  const int el_uv = el_y >> uv_width_subsampling;
  const int eb_uv = eb_y >> uv_height_subsampling;
  const int er_uv = er_y >> uv_width_subsampling;

  if (src->flags & YV12_FLAG_HIGHBITDEPTH) {
    highbd_copy_and_extend_plane(src->y_buffer, src->y_stride, dst->y_buffer,
                                 dst->y_stride, src->y_crop_width,
                                 src->y_crop_height, et_y, el_y, eb_y, er_y);
    if (!src->monochrome) {
      highbd_copy_and_extend_plane(
          src->u_buffer, src->uv_stride, dst->u_buffer, dst->uv_stride,
          src->uv_crop_width, src->uv_crop_height, et_uv, el_uv, eb_uv, er_uv);
      highbd_copy_and_extend_plane(
          src->v_buffer, src->uv_stride, dst->v_buffer, dst->uv_stride,
          src->uv_crop_width, src->uv_crop_height, et_uv, el_uv, eb_uv, er_uv);
    }
    return;
  }

  copy_and_extend_plane(src->y_buffer, src->y_stride, dst->y_buffer,
                        dst->y_stride, src->y_crop_width, src->y_crop_height,
                        et_y, el_y, eb_y, er_y, 1);
  if (!src->monochrome) {
    // detect nv12 format
    const int chroma_step = src->v_buffer ? 1 : 2;
    const uint8_t *src_v_buffer =
        src->v_buffer ? src->v_buffer : src->u_buffer + 1;
    copy_and_extend_plane(src->u_buffer, src->uv_stride, dst->u_buffer,
                          dst->uv_stride, src->uv_crop_width,
                          src->uv_crop_height, et_uv, el_uv, eb_uv, er_uv,
                          chroma_step);
    copy_and_extend_plane(src_v_buffer, src->uv_stride, dst->v_buffer,
                          dst->uv_stride, src->uv_crop_width,
                          src->uv_crop_height, et_uv, el_uv, eb_uv, er_uv,
                          chroma_step);
  }
}